

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

unsigned_long_long
trap_oh_errors<unsigned_long_long>
          (qpdf_data qpdf,function<unsigned_long_long_()> *fallback,
          function<unsigned_long_long_(_qpdf_data_*)> *fn)

{
  uint uVar1;
  function<unsigned_long_long_()> *this;
  element_type *this_00;
  element_type *peVar2;
  element_type *this_01;
  element_type *peVar3;
  char *cstr;
  Pipeline *this_02;
  shared_ptr<QPDFLogger> local_d8;
  QPDFLogger local_c8;
  int local_b4;
  string local_b0;
  qpdf_error_code_e local_90 [4];
  anon_class_40_2_c964147e local_80;
  function<void_(_qpdf_data_*)> local_58;
  uint local_34;
  qpdf_data p_Stack_30;
  QPDF_ERROR_CODE status;
  unsigned_long_long ret;
  function<unsigned_long_long_(_qpdf_data_*)> *fn_local;
  function<unsigned_long_long_()> *fallback_local;
  qpdf_data qpdf_local;
  
  local_80.ret = (unsigned_long_long *)&stack0xffffffffffffffd0;
  ret = (unsigned_long_long)fn;
  fn_local = (function<unsigned_long_long_(_qpdf_data_*)> *)fallback;
  fallback_local = (function<unsigned_long_long_()> *)qpdf;
  std::function<unsigned_long_long_(_qpdf_data_*)>::function(&local_80.fn,fn);
  std::function<void(_qpdf_data*)>::
  function<trap_oh_errors<unsigned_long_long>(_qpdf_data*,std::function<unsigned_long_long()>,std::function<unsigned_long_long(_qpdf_data*)>)::_lambda(_qpdf_data*)_1_,void>
            ((function<void(_qpdf_data*)> *)&local_58,&local_80);
  uVar1 = trap_errors(qpdf,&local_58);
  std::function<void_(_qpdf_data_*)>::~function(&local_58);
  trap_oh_errors<unsigned_long_long>(_qpdf_data*,std::function<unsigned_long_long()>,std::function<unsigned_long_long(_qpdf_data*)>)
  ::{lambda(_qpdf_data*)#1}::~function((_lambda__qpdf_data___1_ *)&local_80);
  if ((uVar1 & 2) == 0) {
    qpdf_local = p_Stack_30;
  }
  else {
    local_34 = uVar1;
    if (((ulong)fallback_local[5].super__Function_base._M_manager & 1) == 0) {
      QTC::TC("qpdf","qpdf-c warn about oh error",
              (uint)(((ulong)fallback_local[5].super__Function_base._M_manager & 0x100) == 0));
      if (((ulong)fallback_local[5].super__Function_base._M_manager & 0x100) == 0) {
        this = fallback_local + 2;
        local_90[0] = qpdf_e_internal;
        this_00 = std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             fallback_local);
        QPDF::getFilename_abi_cxx11_(&local_b0,this_00);
        local_b4 = 0;
        std::__cxx11::list<QPDFExc,std::allocator<QPDFExc>>::
        emplace_back<qpdf_error_code_e,std::__cxx11::string,char_const(&)[1],int,char_const(&)[129]>
                  ((list<QPDFExc,std::allocator<QPDFExc>> *)this,local_90,&local_b0,
                   (char (*) [1])0x434088,&local_b4,
                   (char (*) [129])
                   "C API function caught an exception that it isn\'t returning; please point the application developer to ERROR HANDLING in qpdf-c.h"
                  );
        std::__cxx11::string::~string((string *)&local_b0);
        *(undefined1 *)((long)&fallback_local[5].super__Function_base._M_manager + 1) = 1;
      }
      QPDFLogger::defaultLogger();
      peVar2 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_d8);
      QPDFLogger::getError(&local_c8,SUB81(peVar2,0));
      this_01 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator*((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )&local_c8);
      peVar3 = std::__shared_ptr_access<QPDFExc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFExc,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          (fallback_local + 1));
      cstr = (char *)(**(code **)(*(long *)peVar3 + 0x10))();
      this_02 = Pipeline::operator<<(this_01,cstr);
      Pipeline::operator<<(this_02,"\n");
      std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&local_c8);
      std::shared_ptr<QPDFLogger>::~shared_ptr(&local_d8);
    }
    qpdf_local = (qpdf_data)std::function<unsigned_long_long_()>::operator()(fallback);
  }
  return (unsigned_long_long)qpdf_local;
}

Assistant:

static RET
trap_oh_errors(qpdf_data qpdf, std::function<RET()> fallback, std::function<RET(qpdf_data)> fn)
{
    // Note: fallback is a function so we don't have to evaluate it unless needed. This is important
    // because sometimes the fallback creates an object.
    RET ret;
    QPDF_ERROR_CODE status = trap_errors(qpdf, [&ret, fn](qpdf_data q) { ret = fn(q); });
    if (status & QPDF_ERRORS) {
        if (!qpdf->silence_errors) {
            QTC::TC("qpdf", "qpdf-c warn about oh error", qpdf->oh_error_occurred ? 0 : 1);
            if (!qpdf->oh_error_occurred) {
                qpdf->warnings.emplace_back(
                    qpdf_e_internal,
                    qpdf->qpdf->getFilename(),
                    "",
                    0,
                    "C API function caught an exception that it isn't returning; please point the "
                    "application developer to ERROR HANDLING in qpdf-c.h");
                qpdf->oh_error_occurred = true;
            }
            *QPDFLogger::defaultLogger()->getError() << qpdf->error->what() << "\n";
        }
        return fallback();
    }
    return ret;
}